

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_InternalSerialize
          (CodeGeneratorRequest *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  _func_int **pp_Var1;
  Version *value;
  CodeGeneratorRequest *pCVar2;
  ptrdiff_t pVar3;
  uint32_t num;
  bool bVar4;
  int iVar5;
  uint uVar6;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar7;
  void *__src;
  uint32_t *puVar8;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *pRVar9;
  const_reference pFVar10;
  UnknownFieldSet *unknown_fields;
  byte *__dest;
  string_view sVar11;
  FileDescriptorProto *repfield_1;
  uint n_2;
  uint i_2;
  FileDescriptorProto *repfield;
  uint n_1;
  uint i_1;
  string_view local_b8;
  string *local_a8;
  string *_s;
  const_reference local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  int local_80;
  int n;
  int i;
  uint32_t cached_has_bits;
  CodeGeneratorRequest *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  CodeGeneratorRequest *this_local;
  char *local_50;
  size_t local_48;
  ptrdiff_t size;
  const_reference local_38;
  uint32_t local_2c;
  CodeGeneratorRequest *local_28;
  EpsCopyOutputStream *local_20;
  byte *local_18;
  uint local_c;
  
  n = 0;
  local_80 = 0;
  _i = this;
  this_ = (CodeGeneratorRequest *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  s._4_4_ = _internal_file_to_generate_size(this);
  for (; local_80 < s._4_4_; local_80 = local_80 + 1) {
    this_00 = _internal_file_to_generate_abi_cxx11_(_i);
    local_90 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::Get(this_00,local_80);
    pcVar7 = (char *)std::__cxx11::string::data();
    iVar5 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&_s,
               "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    protobuf::internal::WireFormat::VerifyUTF8StringNamedField(pcVar7,iVar5,SERIALIZE,__s);
    pCVar2 = this_;
    local_28 = this_;
    local_2c = 1;
    local_38 = local_90;
    size = (ptrdiff_t)stream_local;
    local_48 = std::__cxx11::string::size();
    pVar3 = size;
    bVar4 = true;
    if ((long)local_48 < 0x80) {
      pp_Var1 = (pCVar2->super_Message).super_MessageLite._vptr_MessageLite;
      iVar5 = io::EpsCopyOutputStream::TagSize(local_2c << 3);
      bVar4 = (long)pp_Var1 + (-(long)iVar5 - pVar3) + 0xf < (long)local_48;
    }
    num = local_2c;
    if (bVar4) {
      sVar11 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      local_50 = sVar11._M_str;
      this_local = (CodeGeneratorRequest *)sVar11._M_len;
      local_20 = (EpsCopyOutputStream *)
                 io::EpsCopyOutputStream::WriteStringOutline
                           ((EpsCopyOutputStream *)pCVar2,num,sVar11,(uint8_t *)size);
    }
    else {
      local_18 = (byte *)size;
      for (local_c = local_2c << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
        *local_18 = (byte)local_c | 0x80;
        local_18 = local_18 + 1;
      }
      *local_18 = (byte)local_c;
      __dest = local_18 + 2;
      local_18[1] = (byte)local_48;
      size = (ptrdiff_t)__dest;
      local_18 = local_18 + 1;
      __src = (void *)std::__cxx11::string::data();
      memcpy(__dest,__src,local_48);
      local_20 = (EpsCopyOutputStream *)(size + local_48);
    }
    stream_local = local_20;
  }
  puVar8 = protobuf::internal::HasBits<1>::operator[](&(_i->field_0)._impl_._has_bits_,0);
  n = *puVar8;
  if ((n & 1U) != 0) {
    local_a8 = _internal_parameter_abi_cxx11_(_i);
    pcVar7 = (char *)std::__cxx11::string::data();
    iVar5 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_b8,"google.protobuf.compiler.CodeGeneratorRequest.parameter");
    protobuf::internal::WireFormat::VerifyUTF8StringNamedField(pcVar7,iVar5,SERIALIZE,local_b8);
    pCVar2 = this_;
    sVar11 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a8);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pCVar2,2,sVar11,(uint8_t *)stream_local);
  }
  if ((n & 2U) != 0) {
    value = (_i->field_0)._impl_.compiler_version_;
    iVar5 = Version::GetCachedSize((_i->field_0)._impl_.compiler_version_);
    stream_local = (EpsCopyOutputStream *)
                   protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)value,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield._4_4_ = 0;
  uVar6 = _internal_proto_file_size(_i);
  for (; repfield._4_4_ < uVar6; repfield._4_4_ = repfield._4_4_ + 1) {
    pRVar9 = _internal_proto_file(_i);
    pFVar10 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::Get(pRVar9,repfield._4_4_);
    iVar5 = FileDescriptorProto::GetCachedSize(pFVar10);
    stream_local = (EpsCopyOutputStream *)
                   protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0xf,(MessageLite *)pFVar10,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_1._4_4_ = 0;
  uVar6 = _internal_source_file_descriptors_size(_i);
  for (; repfield_1._4_4_ < uVar6; repfield_1._4_4_ = repfield_1._4_4_ + 1) {
    pRVar9 = _internal_source_file_descriptors(_i);
    pFVar10 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::Get(pRVar9,repfield_1._4_4_);
    iVar5 = FileDescriptorProto::GetCachedSize(pFVar10);
    stream_local = (EpsCopyOutputStream *)
                   protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x11,(MessageLite *)pFVar10,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  bVar4 = protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(_i->super_Message).super_MessageLite._internal_metadata_);
  if (bVar4) {
    unknown_fields =
         protobuf::internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(_i->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL CodeGeneratorRequest::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const CodeGeneratorRequest& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated string file_to_generate = 1;
  for (int i = 0, n = this_._internal_file_to_generate_size(); i < n; ++i) {
    const auto& s = this_._internal_file_to_generate().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    target = stream->WriteString(1, s, target);
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string parameter = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_parameter();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional .google.protobuf.compiler.Version compiler_version = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.compiler_version_, this_._impl_.compiler_version_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_proto_file_size());
       i < n; i++) {
    const auto& repfield = this_._internal_proto_file().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            15, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.FileDescriptorProto source_file_descriptors = 17;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_source_file_descriptors_size());
       i < n; i++) {
    const auto& repfield = this_._internal_source_file_descriptors().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            17, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorRequest)
  return target;
}